

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

void Abc_NtkMiterFinalize
               (Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Abc_Ntk_t *pNtkMiter,int fComb,int nPartSize,
               int fImplic,int fMulti)

{
  Abc_Aig_t *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *p_00;
  void *pvVar8;
  char *pcVar9;
  int local_46c;
  int iCur;
  int k;
  int i_1;
  int nParts;
  Vec_Ptr_t *vPairsPart;
  char Buffer [1024];
  int local_4c;
  int i;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pMiter;
  Vec_Ptr_t *vPairs;
  int fImplic_local;
  int nPartSize_local;
  int fComb_local;
  Abc_Ntk_t *pNtkMiter_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  if ((nPartSize != 0) && (fMulti != 0)) {
    __assert_fail("nPartSize == 0 || fMulti == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x11e,
                  "void Abc_NtkMiterFinalize(Abc_Ntk_t *, Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)"
                 );
  }
  p = Vec_PtrAlloc(100);
  if (fComb == 0) {
    for (local_4c = 0; iVar2 = Abc_NtkPoNum(pNtk1), local_4c < iVar2; local_4c = local_4c + 1) {
      pAVar6 = Abc_NtkPo(pNtk1,local_4c);
      if (fMulti == 0) {
        pAVar6 = Abc_ObjChild0Copy(pAVar6);
        Vec_PtrPush(p,pAVar6);
        pAVar6 = Abc_NtkPo(pNtk2,local_4c);
        pAVar6 = Abc_ObjChild0Copy(pAVar6);
        Vec_PtrPush(p,pAVar6);
      }
      else {
        pAVar1 = (Abc_Aig_t *)pNtkMiter->pManFunc;
        pAVar6 = Abc_ObjChild0Copy(pAVar6);
        pAVar7 = Abc_NtkCo(pNtk2,local_4c);
        pAVar7 = Abc_ObjChild0Copy(pAVar7);
        pAVar6 = Abc_AigXor(pAVar1,pAVar6,pAVar7);
        pAVar7 = Abc_NtkPo(pNtkMiter,local_4c);
        Abc_ObjAddFanin(pAVar7,pAVar6);
      }
    }
    for (local_4c = 0; iVar2 = Vec_PtrSize(pNtk1->vBoxes), local_4c < iVar2; local_4c = local_4c + 1
        ) {
      pAVar6 = Abc_NtkBox(pNtk1,local_4c);
      iVar2 = Abc_ObjIsLatch(pAVar6);
      if (iVar2 != 0) {
        pAVar7 = Abc_ObjFanin0(pAVar6);
        pAVar7 = (pAVar7->field_6).pCopy;
        pAVar6 = Abc_ObjFanin0(pAVar6);
        pAVar6 = Abc_ObjChild0Copy(pAVar6);
        Abc_ObjAddFanin(pAVar7,pAVar6);
      }
    }
    for (local_4c = 0; iVar2 = Vec_PtrSize(pNtk2->vBoxes), local_4c < iVar2; local_4c = local_4c + 1
        ) {
      pAVar6 = Abc_NtkBox(pNtk2,local_4c);
      iVar2 = Abc_ObjIsLatch(pAVar6);
      if (iVar2 != 0) {
        pAVar7 = Abc_ObjFanin0(pAVar6);
        pAVar7 = (pAVar7->field_6).pCopy;
        pAVar6 = Abc_ObjFanin0(pAVar6);
        pAVar6 = Abc_ObjChild0Copy(pAVar6);
        Abc_ObjAddFanin(pAVar7,pAVar6);
      }
    }
  }
  else {
    for (local_4c = 0; iVar2 = Abc_NtkCoNum(pNtk1), local_4c < iVar2; local_4c = local_4c + 1) {
      pAVar6 = Abc_NtkCo(pNtk1,local_4c);
      if (fMulti == 0) {
        pAVar6 = Abc_ObjChild0Copy(pAVar6);
        Vec_PtrPush(p,pAVar6);
        pAVar6 = Abc_NtkCo(pNtk2,local_4c);
        pAVar6 = Abc_ObjChild0Copy(pAVar6);
        Vec_PtrPush(p,pAVar6);
      }
      else {
        pAVar1 = (Abc_Aig_t *)pNtkMiter->pManFunc;
        pAVar6 = Abc_ObjChild0Copy(pAVar6);
        pAVar7 = Abc_NtkCo(pNtk2,local_4c);
        pAVar7 = Abc_ObjChild0Copy(pAVar7);
        pAVar6 = Abc_AigXor(pAVar1,pAVar6,pAVar7);
        pAVar7 = Abc_NtkPo(pNtkMiter,local_4c);
        Abc_ObjAddFanin(pAVar7,pAVar6);
      }
    }
  }
  if (nPartSize < 1) {
    if (fMulti == 0) {
      pAVar6 = Abc_AigMiter((Abc_Aig_t *)pNtkMiter->pManFunc,p,fImplic);
      pAVar7 = Abc_NtkPo(pNtkMiter,0);
      Abc_ObjAddFanin(pAVar7,pAVar6);
    }
  }
  else {
    iVar2 = Vec_PtrSize(p);
    iVar3 = Abc_NtkCoNum(pNtk1);
    if (iVar2 != iVar3 * 2) {
      __assert_fail("Vec_PtrSize(vPairs) == 2 * Abc_NtkCoNum(pNtk1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                    ,0x158,
                    "void Abc_NtkMiterFinalize(Abc_Ntk_t *, Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)"
                   );
    }
    iVar2 = Abc_NtkCoNum(pNtk1);
    iVar3 = Abc_NtkCoNum(pNtk1);
    p_00 = Vec_PtrAlloc(nPartSize);
    for (iCur = 0; iCur < (int)(iVar2 / nPartSize + (uint)(0 < iVar3 % nPartSize)); iCur = iCur + 1)
    {
      Vec_PtrClear(p_00);
      for (local_46c = 0; local_46c < nPartSize; local_46c = local_46c + 1) {
        iVar4 = iCur * nPartSize + local_46c;
        iVar5 = Abc_NtkCoNum(pNtk1);
        if (iVar5 <= iVar4) break;
        pvVar8 = Vec_PtrEntry(p,iVar4 * 2);
        Vec_PtrPush(p_00,pvVar8);
        pvVar8 = Vec_PtrEntry(p,iVar4 * 2 + 1);
        Vec_PtrPush(p_00,pvVar8);
      }
      pAVar6 = Abc_AigMiter((Abc_Aig_t *)pNtkMiter->pManFunc,p_00,fImplic);
      pAVar7 = Abc_NtkCreatePo(pNtkMiter);
      Abc_ObjAddFanin(pAVar7,pAVar6);
      if (nPartSize == 1) {
        pAVar6 = Abc_NtkCo(pNtk1,iCur);
        pcVar9 = Abc_ObjName(pAVar6);
        sprintf((char *)&vPairsPart,"%s",pcVar9);
      }
      else {
        sprintf((char *)&vPairsPart,"%d",(ulong)(uint)iCur);
      }
      Abc_ObjAssignName(pAVar7,"miter_",(char *)&vPairsPart);
    }
    Vec_PtrFree(p_00);
  }
  Vec_PtrFree(p);
  return;
}

Assistant:

void Abc_NtkMiterFinalize( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Abc_Ntk_t * pNtkMiter, int fComb, int nPartSize, int fImplic, int fMulti )
{
    Vec_Ptr_t * vPairs;
    Abc_Obj_t * pMiter, * pNode;
    int i;
    assert( nPartSize == 0 || fMulti == 0 );
    // collect the PO pairs from both networks
    vPairs = Vec_PtrAlloc( 100 );
    if ( fComb )
    {
        // collect the CO nodes for the miter
        Abc_NtkForEachCo( pNtk1, pNode, i )
        {
            if ( fMulti )
            {
                pMiter = Abc_AigXor( (Abc_Aig_t *)pNtkMiter->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild0Copy(Abc_NtkCo(pNtk2, i)) );
                Abc_ObjAddFanin( Abc_NtkPo(pNtkMiter,i), pMiter );
            }
            else
            {
                Vec_PtrPush( vPairs, Abc_ObjChild0Copy(pNode) );
                pNode = Abc_NtkCo( pNtk2, i );
                Vec_PtrPush( vPairs, Abc_ObjChild0Copy(pNode) );
            }
        }
    }
    else
    {
        // collect the PO nodes for the miter
        Abc_NtkForEachPo( pNtk1, pNode, i )
        {
            if ( fMulti )
            {
                pMiter = Abc_AigXor( (Abc_Aig_t *)pNtkMiter->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild0Copy(Abc_NtkCo(pNtk2, i)) );
                Abc_ObjAddFanin( Abc_NtkPo(pNtkMiter,i), pMiter );
            }
            else
            {
                Vec_PtrPush( vPairs, Abc_ObjChild0Copy(pNode) );
                pNode = Abc_NtkPo( pNtk2, i );
                Vec_PtrPush( vPairs, Abc_ObjChild0Copy(pNode) );
            }
        }
        // connect new latches
        Abc_NtkForEachLatch( pNtk1, pNode, i )
            Abc_ObjAddFanin( Abc_ObjFanin0(pNode)->pCopy, Abc_ObjChild0Copy(Abc_ObjFanin0(pNode)) );
        Abc_NtkForEachLatch( pNtk2, pNode, i )
            Abc_ObjAddFanin( Abc_ObjFanin0(pNode)->pCopy, Abc_ObjChild0Copy(Abc_ObjFanin0(pNode)) );
    }
    // add the miter
    if ( nPartSize <= 0 )
    {
        if ( !fMulti )
        {
            pMiter = Abc_AigMiter( (Abc_Aig_t *)pNtkMiter->pManFunc, vPairs, fImplic );
            Abc_ObjAddFanin( Abc_NtkPo(pNtkMiter,0), pMiter );
        }
    }
    else
    {
        char Buffer[1024];
        Vec_Ptr_t * vPairsPart;
        int nParts, i, k, iCur;
        assert( Vec_PtrSize(vPairs) == 2 * Abc_NtkCoNum(pNtk1) );
        // create partitions
        nParts = Abc_NtkCoNum(pNtk1) / nPartSize + (int)((Abc_NtkCoNum(pNtk1) % nPartSize) > 0);
        vPairsPart = Vec_PtrAlloc( nPartSize );
        for ( i = 0; i < nParts; i++ )
        {
            Vec_PtrClear( vPairsPart );
            for ( k = 0; k < nPartSize; k++ )
            {
                iCur = i * nPartSize + k;
                if ( iCur >= Abc_NtkCoNum(pNtk1) )
                    break;
                Vec_PtrPush( vPairsPart, Vec_PtrEntry(vPairs, 2*iCur  ) );
                Vec_PtrPush( vPairsPart, Vec_PtrEntry(vPairs, 2*iCur+1) );
            }
            pMiter = Abc_AigMiter( (Abc_Aig_t *)pNtkMiter->pManFunc, vPairsPart, fImplic );
            pNode = Abc_NtkCreatePo( pNtkMiter );
            Abc_ObjAddFanin( pNode, pMiter );
            // assign the name to the node
            if ( nPartSize == 1 )
                sprintf( Buffer, "%s", Abc_ObjName(Abc_NtkCo(pNtk1,i)) );
            else
                sprintf( Buffer, "%d", i );
            Abc_ObjAssignName( pNode, "miter_", Buffer );
        }
        Vec_PtrFree( vPairsPart );
    }
    Vec_PtrFree( vPairs );
}